

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturerecognizer.cpp
# Opt level: O0

void QGestureRecognizer::unregisterRecognizer(GestureType type)

{
  QApplicationPrivate *pQVar1;
  InstanceCreation in_EDI;
  QApplicationPrivate *qAppPriv;
  QGestureManager *in_stack_00000060;
  GestureType in_stack_0000017c;
  
  pQVar1 = QApplicationPrivate::instance();
  if ((pQVar1 != (QApplicationPrivate *)0x0) && (pQVar1->gestureManager != (QGestureManager *)0x0))
  {
    QGestureManager::instance(in_EDI);
    QGestureManager::unregisterGestureRecognizer(in_stack_00000060,in_stack_0000017c);
  }
  return;
}

Assistant:

void QGestureRecognizer::unregisterRecognizer(Qt::GestureType type)
{
    auto qAppPriv = QApplicationPrivate::instance();
    if (!qAppPriv)
        return;
    if (!qAppPriv->gestureManager)
        return;
    QGestureManager::instance()->unregisterGestureRecognizer(type);
}